

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cc
# Opt level: O3

void cnn::Initialize(int *argc,char ***argv,uint random_seed,bool shared_parameters)

{
  int iVar1;
  long lVar2;
  AlignedMemoryPool<6U> *pAVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  ulong uVar6;
  byte bVar7;
  unsigned_long num_mb;
  string a2;
  string arg;
  istringstream c;
  uint local_140c;
  undefined1 *local_13f8 [2];
  undefined1 local_13e8 [16];
  char *local_13d8;
  long local_13d0;
  char local_13c8 [16];
  undefined1 local_13b8 [5000];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[cnn] using CPU\n",0x10)
  ;
  kSCALAR_MINUSONE = (undefined4 *)cnn_mm_malloc(4,0x100);
  *kSCALAR_MINUSONE = 0xbf800000;
  kSCALAR_ONE = (undefined4 *)cnn_mm_malloc(4,0x100);
  *kSCALAR_ONE = 0x3f800000;
  kSCALAR_ZERO = (undefined4 *)cnn_mm_malloc(4,0x100);
  puVar5 = &kSCALAR_ZERO;
  *kSCALAR_ZERO = 0;
  if (1 < *argc) {
    do {
      std::__cxx11::string::string((string *)&local_13d8,(*argv)[1],(allocator *)local_13b8);
      iVar1 = std::__cxx11::string::compare((char *)&local_13d8);
      if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)&local_13d8), iVar1 == 0))
      {
        if (*argc < 2) {
          std::operator<<((ostream *)&std::cerr,
                          "[cnn] --cnn-mem expects an argument (the memory, in megabytes, to reserve)\n"
                         );
          goto LAB_00170fe6;
        }
        std::__cxx11::string::string((string *)local_13f8,(*argv)[2],(allocator *)local_13b8);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_13b8,(string *)local_13f8,_S_in);
        std::istream::_M_extract<unsigned_long>((ulong *)local_13b8);
LAB_00170d77:
        RemoveArgs(argc,argv,(int *)0x1,(int)puVar5);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_13b8);
        std::ios_base::~ios_base((ios_base *)(local_13b8 + 0x78));
        if (local_13f8[0] != local_13e8) {
          operator_delete(local_13f8[0]);
        }
        bVar7 = 1;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_13d8);
        if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)&local_13d8), iVar1 == 0)
           ) {
          if (*argc < 2) {
            std::operator<<((ostream *)&std::cerr,
                            "[cnn] --cnn-seed expects an argument (the random number seed)\n");
            goto LAB_00170fe6;
          }
          std::__cxx11::string::string((string *)local_13f8,(*argv)[2],(allocator *)local_13b8);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_13b8,(string *)local_13f8,_S_in);
          std::istream::_M_extract<unsigned_int>((uint *)local_13b8);
          goto LAB_00170d77;
        }
        puVar5 = (undefined8 *)0x5;
        bVar7 = 0;
        lVar2 = std::__cxx11::string::find((char *)&local_13d8,0x22a5e3,0);
        if (lVar2 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[cnn] Bad command line argument: ",0x21);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_13d8,local_13d0);
          std::endl<char,std::char_traits<char>>(poVar4);
LAB_00170fe6:
          abort();
        }
      }
      if (local_13d8 != local_13c8) {
        operator_delete(local_13d8);
      }
    } while ((bool)(bVar7 & 1 < *argc));
  }
  local_140c = random_seed;
  if (random_seed == 0) {
    std::random_device::random_device((random_device *)local_13b8);
    local_140c = std::random_device::_M_getval();
    std::random_device::_M_fini();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[cnn] random seed: ",0x13);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  rndeng = (ulong *)operator_new(5000);
  uVar6 = (ulong)local_140c;
  lVar2 = 1;
  *rndeng = uVar6;
  do {
    uVar6 = (ulong)(((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar2);
    rndeng[lVar2] = uVar6;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  rndeng[0x270] = 0x270;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[cnn] allocating memory: ",0x19);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"MB\n",3);
  pAVar3 = (AlignedMemoryPool<6U> *)operator_new(0x20);
  pAVar3->shared = false;
  AlignedMemoryPool<6U>::sys_alloc(pAVar3,0x20000000);
  memset(pAVar3->mem,0,pAVar3->capacity);
  fxs = pAVar3;
  pAVar3 = (AlignedMemoryPool<6U> *)operator_new(0x20);
  pAVar3->shared = false;
  AlignedMemoryPool<6U>::sys_alloc(pAVar3,0x20000000);
  memset(pAVar3->mem,0,pAVar3->capacity);
  dEdfs = pAVar3;
  pAVar3 = (AlignedMemoryPool<6U> *)operator_new(0x20);
  pAVar3->shared = shared_parameters;
  AlignedMemoryPool<6U>::sys_alloc(pAVar3,0x20000000);
  memset(pAVar3->mem,0,pAVar3->capacity);
  ps = pAVar3;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"[cnn] memory allocation done.\n",0x1e);
  return;
}

Assistant:

void Initialize(int& argc, char**& argv, unsigned random_seed, bool shared_parameters) {
#if HAVE_CUDA
  cerr << "[cnn] using GPU\n";
  Initialize_GPU(argc, argv);
#else
  cerr << "[cnn] using CPU\n";
  kSCALAR_MINUSONE = (float*) cnn_mm_malloc(sizeof(float), 256);
  *kSCALAR_MINUSONE = -1;
  kSCALAR_ONE = (float*) cnn_mm_malloc(sizeof(float), 256);
  *kSCALAR_ONE = 1;
  kSCALAR_ZERO = (float*) cnn_mm_malloc(sizeof(float), 256);
  *kSCALAR_ZERO = 0;
#endif
  unsigned long num_mb = 512UL;
  int argi = 1;
  while(argi < argc) {
    string arg = argv[argi];
    if (arg == "--cnn-mem" || arg == "--cnn_mem") {
      if ((argi + 1) > argc) {
        cerr << "[cnn] --cnn-mem expects an argument (the memory, in megabytes, to reserve)\n";
        abort();
      } else {
        string a2 = argv[argi+1];
        istringstream c(a2); c >> num_mb;
        RemoveArgs(argc, argv, argi, 2);
      }
    } else if (arg == "--cnn-seed" || arg == "--cnn_seed") {
      if ((argi + 1) > argc) {
        cerr << "[cnn] --cnn-seed expects an argument (the random number seed)\n";
        abort();
      } else {
        string a2 = argv[argi+1];
        istringstream c(a2); c >> random_seed;
        RemoveArgs(argc, argv, argi, 2);
      }
    } else if (arg.find("--cnn") == 0) {
      cerr << "[cnn] Bad command line argument: " << arg << endl;
      abort();
    } else { break; }
  }
  if (random_seed == 0) {
    random_device rd;
    random_seed = rd();
  }
  cerr << "[cnn] random seed: " << random_seed << endl;
  rndeng = new mt19937(random_seed);

  cerr << "[cnn] allocating memory: " << num_mb << "MB\n";
  fxs = new AlignedMemoryPool<ALIGN>(num_mb << 20); // node values
  dEdfs = new AlignedMemoryPool<ALIGN>(num_mb << 20); // node gradients
  ps = new AlignedMemoryPool<ALIGN>(num_mb << 20, shared_parameters); // parameters
  cerr << "[cnn] memory allocation done.\n";
}